

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

void backward::SignalHandling::handleSignal(int param_1,siginfo_t *info,void *_ctx)

{
  StackTrace st;
  Printer printer;
  StackTrace local_108;
  Printer local_c8;
  
  local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  _stacktrace.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  _stacktrace.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  super_StackTraceImplBase._context = (void *)0x0;
  local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  super_StackTraceImplBase._error_addr = (void *)0x0;
  local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  super_StackTraceImplBase._thread_id = 0;
  local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  super_StackTraceImplBase._skip = 0;
  local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  _stacktrace.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (*(void **)((long)_ctx + 0xa8) == (void *)0x0) {
    StackTraceImpl<backward::system_tag::linux_tag>::load_here
              (&local_108.super_StackTraceImpl<backward::system_tag::linux_tag>,0x20,_ctx,
               (info->_sifields)._sigfault.si_addr);
  }
  else {
    StackTraceImpl<backward::system_tag::linux_tag>::load_from
              (&local_108.super_StackTraceImpl<backward::system_tag::linux_tag>,
               *(void **)((long)_ctx + 0xa8),0x20,_ctx,(info->_sifields)._sigfault.si_addr);
  }
  local_c8.snippet = true;
  local_c8.color_mode = automatic;
  local_c8.address = false;
  local_c8.object = false;
  local_c8.inliner_context_size = 5;
  local_c8.trace_context_size = 7;
  TraceResolverLinuxBase::TraceResolverLinuxBase((TraceResolverLinuxBase *)&local_c8._resolver);
  local_c8._snippets._src_files._M_h._M_buckets =
       &local_c8._snippets._src_files._M_h._M_single_bucket;
  local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
  super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>._symbols._val =
       (char **)0x0;
  local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
  super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>._symbols._empty =
       true;
  local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
  super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
  super_TraceResolverLinuxBase.super_TraceResolverImplBase._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxImpl_001ccad8;
  local_c8._snippets._src_files._M_h._M_bucket_count = 1;
  local_c8._snippets._src_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8._snippets._src_files._M_h._M_element_count = 0;
  local_c8._snippets._src_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_c8._snippets._src_files._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8._snippets._src_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c8.address = true;
  Printer::print<backward::StackTrace>(&local_c8,&local_108,_stderr);
  psiginfo((siginfo_t *)info,(char *)0x0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_backward::SourceFile>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_backward::SourceFile>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_backward::SourceFile>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_backward::SourceFile>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_c8._snippets);
  local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
  super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
  super_TraceResolverLinuxBase.super_TraceResolverImplBase._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxImpl_001ccb78;
  if (local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
      super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>._symbols._empty
      == false) {
    free(local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
         super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>._symbols._val)
    ;
  }
  local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
  super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
  super_TraceResolverLinuxBase.super_TraceResolverImplBase._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxBase_001ccba8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
         super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
         super_TraceResolverLinuxBase.exec_path_._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
                 super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
                 super_TraceResolverLinuxBase.exec_path_ + 0x10U)) {
    operator_delete(local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
                    super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
                    super_TraceResolverLinuxBase.exec_path_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
         super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
         super_TraceResolverLinuxBase.argv0_._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
                 super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
                 super_TraceResolverLinuxBase.argv0_ + 0x10U)) {
    operator_delete(local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
                    super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
                    super_TraceResolverLinuxBase.argv0_._M_dataplus._M_p);
  }
  local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
  super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
  super_TraceResolverLinuxBase.super_TraceResolverImplBase._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverImplBase_001ccbd8;
  if (local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
      super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
      super_TraceResolverLinuxBase.super_TraceResolverImplBase._demangler.
      super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._empty == false) {
    free(local_c8._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
         super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
         super_TraceResolverLinuxBase.super_TraceResolverImplBase._demangler.
         super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._val);
  }
  if (local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
      _stacktrace.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super_StackTraceImpl<backward::system_tag::linux_tag>.
                    super_StackTraceImplHolder._stacktrace.
                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void handleSignal(int, siginfo_t *info, void *_ctx) {
    ucontext_t *uctx = static_cast<ucontext_t *>(_ctx);

    StackTrace st;
    void *error_addr = nullptr;
#ifdef REG_RIP // x86_64
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.gregs[REG_RIP]);
#elif defined(REG_EIP) // x86_32
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.gregs[REG_EIP]);
#elif defined(__arm__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.arm_pc);
#elif defined(__aarch64__)
    #if defined(__APPLE__)
      error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__pc);
    #else
      error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.pc);
    #endif
#elif defined(__mips__)
    error_addr = reinterpret_cast<void *>(
        reinterpret_cast<struct sigcontext *>(&uctx->uc_mcontext)->sc_pc);
#elif defined(__ppc__) || defined(__powerpc) || defined(__powerpc__) ||        \
    defined(__POWERPC__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.regs->nip);
#elif defined(__riscv)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.__gregs[REG_PC]);
#elif defined(__s390x__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.psw.addr);
#elif defined(__APPLE__) && defined(__x86_64__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__rip);
#elif defined(__APPLE__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__eip);
#else
#warning ":/ sorry, ain't know no nothing none not of your architecture!"
#endif
    if (error_addr) {
      st.load_from(error_addr, 32, reinterpret_cast<void *>(uctx),
                   info->si_addr);
    } else {
      st.load_here(32, reinterpret_cast<void *>(uctx), info->si_addr);
    }

    Printer printer;
    printer.address = true;
    printer.print(st, stderr);

#if (defined(_XOPEN_SOURCE) && _XOPEN_SOURCE >= 700) || \
    (defined(_POSIX_C_SOURCE) && _POSIX_C_SOURCE >= 200809L)
    psiginfo(info, nullptr);
#else
    (void)info;
#endif
  }